

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_3796a4::HandleGetWarningMode
          (anon_unknown_dwarf_3796a4 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyID id;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  PolicyID pid;
  PolicyID local_74;
  string local_70;
  undefined8 local_50;
  char *local_48;
  string local_40;
  
  if ((long)args - (long)this == 0x60) {
    bVar1 = cmPolicies::GetPolicyID(*(char **)(this + 0x20),&local_74);
    if (bVar1) {
      this_00 = status->Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_70,(cmPolicies *)(ulong)local_74,id);
      value._M_str = local_70._M_dataplus._M_p;
      value._M_len = local_70._M_string_length;
      cmMakefile::AddDefinition(this_00,(string *)(this + 0x40),value);
      local_40.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
      local_40._M_dataplus._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return bVar1;
      }
    }
    else {
      local_70.field_2._8_8_ = *(undefined8 *)(this + 0x20);
      local_70.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x28);
      local_70._M_dataplus._M_p = (char *)0x1a;
      local_70._M_string_length = 0x680a48;
      local_50 = 0x2e;
      local_48 = "\" which is not known to this version of CMake.";
      views._M_len = 3;
      views._M_array = (iterator)&local_70;
      cmCatViews_abi_cxx11_(&local_40,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return bVar1;
      }
    }
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"GET_WARNING must be given exactly 2 additional arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HandleGetWarningMode(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      "GET_WARNING must be given exactly 2 additional arguments.");
    return false;
  }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id.c_str(), pid)) {
    status.SetError(
      cmStrCat("GET_WARNING given policy \"", id,
               "\" which is not known to this version of CMake."));
    return false;
  }

  // Lookup the policy warning.
  status.GetMakefile().AddDefinition(var, cmPolicies::GetPolicyWarning(pid));

  return true;
}